

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *
flatbuffers::GetFieldV<flatbuffers::Offset<flatbuffers::String>>(Table *table,Field *field)

{
  uint16_t field_00;
  BaseType BVar1;
  Type *pTVar2;
  size_t sVar3;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar4;
  bool bVar5;
  Field *field_local;
  Table *table_local;
  
  pTVar2 = reflection::Field::type(field);
  BVar1 = reflection::Type::base_type(pTVar2);
  bVar5 = false;
  if (BVar1 == Vector) {
    pTVar2 = reflection::Field::type(field);
    BVar1 = reflection::Type::element(pTVar2);
    sVar3 = GetTypeSize(BVar1);
    bVar5 = sVar3 == 4;
  }
  if (!bVar5) {
    __assert_fail("field.type()->base_type() == reflection::Vector && sizeof(T) == GetTypeSize(field.type()->element())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                  ,0x93,
                  "Vector<T> *flatbuffers::GetFieldV(const Table &, const reflection::Field &) [T = flatbuffers::Offset<flatbuffers::String>]"
                 );
  }
  field_00 = reflection::Field::offset(field);
  pVVar4 = Table::
           GetPointer<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>*,unsigned_int>
                     (table,field_00);
  return pVVar4;
}

Assistant:

Vector<T> *GetFieldV(const Table &table, const reflection::Field &field) {
  FLATBUFFERS_ASSERT(field.type()->base_type() == reflection::Vector &&
                     sizeof(T) == GetTypeSize(field.type()->element()));
  return table.GetPointer<Vector<T> *>(field.offset());
}